

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsort_impl.h
# Opt level: O2

void secp256k1_hsort(void *ptr,size_t count,size_t size,_func_int_void_ptr_void_ptr_void_ptr *cmp,
                    void *cmp_data)

{
  ulong i;
  void *__src;
  uchar tmp [64];
  undefined1 local_78 [72];
  
  i = count >> 1;
  while (i = i - 1, i != 0xffffffffffffffff) {
    heap_down((uchar *)ptr,i,count,size,cmp,cmp_data);
  }
  __src = (void *)((count - 1) * size + (long)ptr);
  while (1 < count) {
    count = count - 1;
    memcpy(local_78,ptr,size);
    memmove(ptr,__src,size);
    memcpy(__src,local_78,size);
    heap_down((uchar *)ptr,0,count,size,cmp,cmp_data);
    __src = (void *)((long)__src - size);
  }
  return;
}

Assistant:

static void secp256k1_hsort(void *ptr, size_t count, size_t size,
                            int (*cmp)(const void *, const void *, void *),
                            void *cmp_data ) {
    size_t i;

    for(i = count/2; 0 < i; --i) {
        heap_down(ptr, i-1, count, size, cmp, cmp_data);
    }
    for(i = count; 1 < i; --i) {
        /* Extract the largest value from the heap */
        heap_swap(ptr, 0, i-1, size);

        /* Repair the heap condition */
        heap_down(ptr, 0, i-1, size, cmp, cmp_data);
    }
}